

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemModel.hpp
# Opt level: O0

void __thiscall
KalmanExamples::Robot1::SystemModel<float,_Kalman::StandardBase>::updateJacobians
          (SystemModel<float,_Kalman::StandardBase> *this,S *x,C *u)

{
  Scalar *pSVar1;
  float fVar2;
  float fVar3;
  double dVar4;
  C *u_local;
  S *x_local;
  SystemModel<float,_Kalman::StandardBase> *this_local;
  
  Eigen::DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::setZero
            ((DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
             &(this->
              super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
              ).
              super_SystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
              .field_0x2c);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1> *)
                      &(this->
                       super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
                       ).
                       super_SystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
                       .field_0x2c,0,0);
  *pSVar1 = 1.0;
  fVar2 = State<float>::theta(x);
  fVar3 = Control<float>::dtheta(u);
  dVar4 = std::sin((double)(ulong)(uint)(fVar2 + fVar3));
  fVar2 = Control<float>::v(u);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1> *)
                      &(this->
                       super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
                       ).
                       super_SystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
                       .field_0x2c,0,2);
  *pSVar1 = -SUB84(dVar4,0) * fVar2;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1> *)
                      &(this->
                       super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
                       ).
                       super_SystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
                       .field_0x2c,1,1);
  *pSVar1 = 1.0;
  fVar2 = State<float>::theta(x);
  fVar3 = Control<float>::dtheta(u);
  dVar4 = std::cos((double)(ulong)(uint)(fVar2 + fVar3));
  fVar2 = Control<float>::v(u);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1> *)
                      &(this->
                       super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
                       ).
                       super_SystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
                       .field_0x2c,1,2);
  *pSVar1 = SUB84(dVar4,0) * fVar2;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1> *)
                      &(this->
                       super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
                       ).
                       super_SystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
                       .field_0x2c,2,2);
  *pSVar1 = 1.0;
  Eigen::MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::setIdentity
            ((MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
             &(this->
              super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
              ).W);
  return;
}

Assistant:

void updateJacobians( const S& x, const C& u )
    {
        // F = df/dx (Jacobian of state transition w.r.t. the state)
        this->F.setZero();
        
        // partial derivative of x.x() w.r.t. x.x()
        this->F( S::X, S::X ) = 1;
        // partial derivative of x.x() w.r.t. x.theta()
        this->F( S::X, S::THETA ) = -std::sin( x.theta() + u.dtheta() ) * u.v();
        
        // partial derivative of x.y() w.r.t. x.y()
        this->F( S::Y, S::Y ) = 1;
        // partial derivative of x.y() w.r.t. x.theta()
        this->F( S::Y, S::THETA ) = std::cos( x.theta() + u.dtheta() ) * u.v();
        
        // partial derivative of x.theta() w.r.t. x.theta()
        this->F( S::THETA, S::THETA ) = 1;
        
        // W = df/dw (Jacobian of state transition w.r.t. the noise)
        this->W.setIdentity();
        // TODO: more sophisticated noise modelling
        //       i.e. The noise affects the the direction in which we move as 
        //       well as the velocity (i.e. the distance we move)
    }